

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int AnalyseBufWithMIDSeanet(uchar *buf,int buflen,int mid)

{
  int iVar1;
  int iVar2;
  int HexLength;
  int mid_local;
  int buflen_local;
  uchar *buf_local;
  
  if (buflen < 0xb) {
    buf_local._4_4_ = 1;
  }
  else if (*buf == '@') {
    iVar1 = GetHexLengthSeanet(buf);
    iVar2 = GetBinLengthSeanet(buf);
    if (iVar1 == iVar2) {
      if ((uint)buf[10] == (mid & 0xffU)) {
        if (buflen < iVar1 + 6) {
          buf_local._4_4_ = 1;
        }
        else if (buf[iVar1 + 5] == '\n') {
          buf_local._4_4_ = 0;
        }
        else {
          buf_local._4_4_ = 1;
        }
      }
      else {
        buf_local._4_4_ = 1;
      }
    }
    else {
      buf_local._4_4_ = 1;
    }
  }
  else {
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

inline int AnalyseBufWithMIDSeanet(unsigned char* buf, int buflen, int mid)
{
	int HexLength = 0;

	if (buflen < MIN_MESSAGE_LEN_SEANET)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid number of bytes\n"));
		return EXIT_FAILURE;
	}
	if (buf[0] != MESSAGE_HEADER_SEANET)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid message header\n"));
		return EXIT_FAILURE;
	}
	HexLength = GetHexLengthSeanet(buf);
	if (HexLength != GetBinLengthSeanet(buf))
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid Hex or Bin Length\n"));
		return EXIT_FAILURE;
	}
	if (buf[10] != (unsigned char)mid)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid message ID\n"));
		return EXIT_FAILURE;
	}
	if (buflen < HexLength+6)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Incomplete message\n"));
		return EXIT_FAILURE;
	}
	if (buf[HexLength+5] != MESSAGE_TERMINATOR_SEANET)
	{ 
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid message terminator\n"));
		return EXIT_FAILURE;	
	}

	return EXIT_SUCCESS;
}